

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::CreateTar
               (char *outFileName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,cmTarCompression compressType,bool verbose,string *mtime,string *format)

{
  int c;
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  ulong uVar4;
  reference pbVar5;
  cmSystemTools *this;
  char *pcVar6;
  string *format_00;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0 [8];
  string path;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3c8;
  const_iterator i;
  string local_3b8;
  undefined1 local_398 [8];
  cmArchiveWrite a;
  Compress compress;
  allocator local_289;
  string local_288 [8];
  string e;
  undefined1 local_258 [8];
  ofstream fout;
  string cwd;
  string *format_local;
  string *mtime_local;
  bool verbose_local;
  cmTarCompression compressType_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  char *outFileName_local;
  
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)&fout.field_0x1f8,(SystemTools *)0x1,SUB41(compressType,0));
  _Var3 = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream(local_258,outFileName,_Var3);
  bVar1 = std::ios::operator!((ios *)(local_258 + (long)*(_func_int **)((long)local_258 + -0x18)));
  if ((bVar1 & 1) == 0) {
    a.PermissionsMask.Value = 0;
    switch(compressType) {
    case TarCompressGZip:
      a.PermissionsMask.Value = 2;
      break;
    case TarCompressBZip2:
      a.PermissionsMask.Value = 3;
      break;
    case TarCompressXZ:
      a.PermissionsMask.Value = 5;
      break;
    case TarCompressNone:
      a.PermissionsMask.Value = 0;
    }
    c = a.PermissionsMask.Value;
    uVar4 = std::__cxx11::string::empty();
    i._M_current._6_1_ = 0;
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::string((string *)&local_3b8,(string *)format);
    }
    else {
      std::allocator<char>::allocator();
      i._M_current._6_1_ = 1;
      std::__cxx11::string::string
                ((string *)&local_3b8,"paxr",(allocator *)((long)&i._M_current + 7));
    }
    format_00 = &local_3b8;
    cmArchiveWrite::cmArchiveWrite((cmArchiveWrite *)local_398,(ostream *)local_258,c,format_00);
    std::__cxx11::string::~string((string *)&local_3b8);
    if ((i._M_current._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_current + 7));
    }
    cmArchiveWrite::SetMTime((cmArchiveWrite *)local_398,mtime);
    cmArchiveWrite::SetVerbose((cmArchiveWrite *)local_398,verbose);
    local_3c8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(files);
    while( true ) {
      path.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(files);
      bVar2 = __gnu_cxx::operator!=
                        (&local_3c8,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&path.field_2 + 8));
      if (!bVar2) break;
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_3c8);
      std::__cxx11::string::string(local_3f0,(string *)pbVar5);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar6);
      if (bVar2) {
        this = (cmSystemTools *)std::__cxx11::string::c_str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        RelativePath_abi_cxx11_(&local_410,this,pcVar6,(char *)format_00);
        std::__cxx11::string::operator=(local_3f0,(string *)&local_410);
        std::__cxx11::string::~string((string *)&local_410);
      }
      std::__cxx11::string::string((string *)&local_430,local_3f0);
      format_00 = (string *)0x0;
      bVar2 = cmArchiveWrite::Add((cmArchiveWrite *)local_398,&local_430,0,(char *)0x0,true);
      std::__cxx11::string::~string((string *)&local_430);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        a.PermissionsMask.IsValueSet = false;
        a.PermissionsMask._5_3_ = 0;
      }
      else {
        a.PermissionsMask.IsValueSet = true;
        a.PermissionsMask._5_3_ = 0;
      }
      std::__cxx11::string::~string(local_3f0);
      if (a.PermissionsMask._4_4_ != 0) break;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_3c8);
    }
    bVar2 = cmArchiveWrite::operator!((cmArchiveWrite *)local_398);
    if (bVar2) {
      cmArchiveWrite::GetError_abi_cxx11_(&local_450,(cmArchiveWrite *)local_398);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Error(pcVar6,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)&local_450);
    }
    outFileName_local._7_1_ = !bVar2;
    a.PermissionsMask.IsValueSet = true;
    a.PermissionsMask._5_3_ = 0;
    cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_398);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_288,"Cannot open output file \"",&local_289);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    std::__cxx11::string::operator+=(local_288,outFileName);
    std::__cxx11::string::operator+=(local_288,"\": ");
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::__cxx11::string::operator+=(local_288,(string *)&compress);
    std::__cxx11::string::~string((string *)&compress);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Error(pcVar6,(char *)0x0,(char *)0x0,(char *)0x0);
    outFileName_local._7_1_ = false;
    a.PermissionsMask.IsValueSet = true;
    a.PermissionsMask._5_3_ = 0;
    std::__cxx11::string::~string(local_288);
  }
  std::ofstream::~ofstream(local_258);
  std::__cxx11::string::~string((string *)&fout.field_0x1f8);
  return outFileName_local._7_1_;
}

Assistant:

bool cmSystemTools::CreateTar(const char* outFileName,
                              const std::vector<std::string>& files,
                              cmTarCompression compressType, bool verbose,
                              std::string const& mtime,
                              std::string const& format)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  cmsys::ofstream fout(outFileName, std::ios::out | std::ios::binary);
  if (!fout) {
    std::string e = "Cannot open output file \"";
    e += outFileName;
    e += "\": ";
    e += cmSystemTools::GetLastSystemError();
    cmSystemTools::Error(e.c_str());
    return false;
  }
  cmArchiveWrite::Compress compress = cmArchiveWrite::CompressNone;
  switch (compressType) {
    case TarCompressGZip:
      compress = cmArchiveWrite::CompressGZip;
      break;
    case TarCompressBZip2:
      compress = cmArchiveWrite::CompressBZip2;
      break;
    case TarCompressXZ:
      compress = cmArchiveWrite::CompressXZ;
      break;
    case TarCompressNone:
      compress = cmArchiveWrite::CompressNone;
      break;
  }

  cmArchiveWrite a(fout, compress, format.empty() ? "paxr" : format);

  a.SetMTime(mtime);
  a.SetVerbose(verbose);
  for (std::vector<std::string>::const_iterator i = files.begin();
       i != files.end(); ++i) {
    std::string path = *i;
    if (cmSystemTools::FileIsFullPath(path.c_str())) {
      // Get the relative path to the file.
      path = cmSystemTools::RelativePath(cwd.c_str(), path.c_str());
    }
    if (!a.Add(path)) {
      break;
    }
  }
  if (!a) {
    cmSystemTools::Error(a.GetError().c_str());
    return false;
  }
  return true;
#else
  (void)outFileName;
  (void)files;
  (void)verbose;
  return false;
#endif
}